

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::ProcessTryHandler(GlobOpt *this,Instr *instr)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  
  pIVar5 = instr->m_next;
  IVar1 = pIVar5->m_kind;
  if (((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel)) ||
     (*(char *)&(pIVar5[1].m_src2)->_vptr_Opnd != '\x02')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3f88,
                       "(instr->m_next->IsLabelInstr() && instr->m_next->AsLabelInstr()->GetRegion()->GetType() == RegionType::RegionTypeTry)"
                       ,
                       "instr->m_next->IsLabelInstr() && instr->m_next->AsLabelInstr()->GetRegion()->GetType() == RegionType::RegionTypeTry"
                      );
    if (!bVar3) goto LAB_0044acbf;
    *puVar4 = 0;
    pIVar5 = instr->m_next;
    IVar1 = pIVar5->m_kind;
  }
  if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar3) {
LAB_0044acbf:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  ToVar(this,*(BVSparse<Memory::JitArenaAllocator> **)&pIVar5[1].m_src2[5].m_valueType,
        this->currentBlock,(Instr *)0x0);
  return;
}

Assistant:

void
GlobOpt::ProcessTryHandler(IR::Instr* instr)
{
    Assert(instr->m_next->IsLabelInstr() && instr->m_next->AsLabelInstr()->GetRegion()->GetType() == RegionType::RegionTypeTry);

    Region* tryRegion = instr->m_next->AsLabelInstr()->GetRegion();
    BVSparse<JitArenaAllocator> * writeThroughSymbolsSet = tryRegion->writeThroughSymbolsSet;

    ToVar(writeThroughSymbolsSet, this->currentBlock);
}